

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_RgbToBgr(RgbToBgrForm1 RgbToBgr)

{
  uchar uVar1;
  uint8_t value;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_40,value,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  Unit_Test::intensityArray(&local_80,3);
  Unit_Test::fillImage(&local_40,0,0,local_40._width,local_40._height,&local_80);
  (*RgbToBgr)(&local_68,&local_40);
  uVar1 = *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar1;
  bVar2 = Unit_Test::verifyImage(&local_68,&local_80,false);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return bVar2;
}

Assistant:

bool form1_RgbToBgr(RgbToBgrForm1 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const PenguinV_Image::Image output = RgbToBgr( input );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( output, intensity, false );
    }